

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O3

bool __thiscall
jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::
visit_string(basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>
             *this,string_view_type *sv,semantic_tag tag,ser_context *context,error_code *ec)

{
  size_t *psVar1;
  pointer peVar2;
  
  peVar2 = (this->stack_).
           super__Vector_base<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
      ._M_impl.super__Vector_impl_data._M_start != peVar2) {
    if (peVar2[-1].type_ == array) {
      begin_scalar_value(this);
      peVar2 = (this->stack_).
               super__Vector_base<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    if ((peVar2[-1].line_splits_ != multi_line) &&
       ((this->options_).line_length_limit_ <= this->column_)) {
      peVar2[-1].new_line_after_ = true;
      new_line(this);
    }
  }
  write_string(this,sv,tag,context,ec);
  peVar2 = (this->stack_).
           super__Vector_base<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<wchar_t,_jsoncons::stream_sink<wchar_t>,_std::allocator<char>_>::encoding_context>_>
      ._M_impl.super__Vector_impl_data._M_start != peVar2) {
    psVar1 = &peVar2[-1].count_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_string(const string_view_type& sv, semantic_tag tag, const ser_context& context, std::error_code& ec) final
        {
            if (!stack_.empty()) 
            {
                if (stack_.back().is_array())
                {
                    begin_scalar_value();
                }
                if (!stack_.back().is_multi_line() && column_ >= options_.line_length_limit())
                {
                    break_line();
                }
            }
            
            write_string(sv, tag, context, ec);

            end_value();
            JSONCONS_VISITOR_RETURN;
        }